

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

short __thiscall
duckdb::Interpolator<false>::Operation<short,short,duckdb::QuantileDirect<short>>
          (Interpolator<false> *this,short *v_t,Vector *result,QuantileDirect<short> *accessor)

{
  short sVar1;
  idx_t iVar2;
  idx_t iVar3;
  idx_t iVar4;
  long lVar5;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<short>_>_> __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<short>_>_> __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<short>_>_> __comp_01;
  bool bVar6;
  ulong uVar7;
  int iVar8;
  unkbyte10 Var9;
  short result_1;
  short local_42;
  string local_40;
  
  bVar6 = this->desc;
  iVar2 = this->FRN;
  iVar3 = this->begin;
  iVar4 = this->end;
  local_40._M_dataplus._M_p = (pointer)accessor;
  local_40._M_string_length = (size_type)accessor;
  local_40.field_2._M_local_buf[0] = bVar6;
  if (this->CRN == iVar2) {
    if (iVar2 != iVar4 && iVar3 != iVar4) {
      uVar7 = (long)((iVar4 * 2 - iVar3) - iVar3) >> 1;
      lVar5 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_40.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar6;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      ::std::
      __introselect<short*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<short>>>>
                (v_t + iVar3,v_t + iVar2,v_t + iVar4,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
    }
    sVar1 = v_t[this->FRN];
    bVar6 = TryCast::Operation<short,short>(sVar1,&local_42,false);
    if (!bVar6) {
      Var9 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,short>
                (&local_40,(duckdb *)(ulong)(uint)(int)sVar1,(short)((unkuint10)Var9 >> 0x40));
      InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var9,(string *)&local_40);
      __cxa_throw((InvalidInputException *)Var9,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
  }
  else {
    if (iVar2 != iVar4 && iVar3 != iVar4) {
      uVar7 = (long)((iVar4 * 2 - iVar3) - iVar3) >> 1;
      lVar5 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_40.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar6;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      ::std::
      __introselect<short*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<short>>>>
                (v_t + iVar3,v_t + iVar2,v_t + iVar4,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
    }
    iVar2 = this->FRN;
    iVar3 = this->end;
    local_40._M_dataplus._M_p = (pointer)accessor;
    local_40._M_string_length = (size_type)accessor;
    local_40.field_2._M_local_buf[0] = bVar6;
    if (this->CRN != iVar3 && iVar2 != iVar3) {
      uVar7 = (long)((iVar3 * 2 - iVar2) - iVar2) >> 1;
      lVar5 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_40.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar6;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      ::std::
      __introselect<short*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<short>>>>
                (v_t + iVar2,v_t + this->CRN,v_t + iVar3,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
    }
    sVar1 = v_t[this->FRN];
    bVar6 = TryCast::Operation<short,short>(sVar1,&local_42,false);
    if (!bVar6) {
      Var9 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,short>
                (&local_40,(duckdb *)(ulong)(uint)(int)sVar1,(short)((unkuint10)Var9 >> 0x40));
      InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var9,(string *)&local_40);
      __cxa_throw((InvalidInputException *)Var9,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    iVar8 = (int)local_42;
    sVar1 = v_t[this->CRN];
    bVar6 = TryCast::Operation<short,short>(sVar1,&local_42,false);
    if (!bVar6) {
      Var9 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,short>
                (&local_40,(duckdb *)(ulong)(uint)(int)sVar1,(short)((unkuint10)Var9 >> 0x40));
      InvalidInputException::InvalidInputException
                ((InvalidInputException *)Var9,(string *)&local_40);
      __cxa_throw((InvalidInputException *)Var9,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    local_42 = (short)(int)((double)(local_42 - iVar8) *
                            (this->RN -
                            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                             1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                           (double)iVar8);
  }
  return local_42;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}